

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesglobaltypes.cpp
# Opt level: O2

void __thiscall StimulationCommand::StimulationCommand(StimulationCommand *this)

{
  NetworkDataType::NetworkDataType(&this->super_NetworkDataType);
  (this->super_NetworkDataType)._vptr_NetworkDataType = (_func_int **)&PTR__NetworkDataType_002fa990
  ;
  this->leadingPulseWidth_Samples = 0;
  this->leadingPulseAmplitude = '\0';
  this->secondPulseWidth_Samples = 0;
  this->pulsePeriod_Samples = 0;
  this->numPulsesInTrain = 0;
  this->interPhaseDwell_Samples = 0;
  this->startDelay_Samples = 0;
  this->anodePulseLeading = false;
  this->settleOn = true;
  this->_group = '\0';
  this->_pulseMode = '\x01';
  this->cathodeChannel = 0;
  this->anodeChannel = 0;
  this->cathodeNtrodeID = 0;
  this->anodeNtrodeID = 0;
  this->slot = '\0';
  this->preSettle_Samples = 10;
  this->postSettle_Samples = 10;
  this->chargeRecoveryDelay_Samples = 10;
  this->chargeRecoveryLength_Samples = 500;
  this->channelIsSet = false;
  this->slotIsSet = false;
  this->sequencerIsSet = false;
  return;
}

Assistant:

StimulationCommand::StimulationCommand() {


    leadingPulseWidth_Samples = 0;
    leadingPulseAmplitude = 0;
    secondPulseWidth_Samples = 0;
    pulsePeriod_Samples = 0;
    numPulsesInTrain = 0;
    interPhaseDwell_Samples = 0;
    startDelay_Samples = 0; //Delay after go signal.  Useful for synchronizing multiple stim trains with relative delays
    anodePulseLeading = false;
    cathodeChannel = 0;
    anodeChannel = 0;
    cathodeNtrodeID = 0;
    anodeNtrodeID = 0;
    _group = 0;
    _pulseMode = 0x01; //default is biphasic with dwell and cathode leading
    slot = 0;

    //Default settle and charge recovery behavior
    settleOn = true;
    preSettle_Samples = 10;
    postSettle_Samples = 10;
    chargeRecoveryDelay_Samples = 10;
    chargeRecoveryLength_Samples = 500;

    //Validation flags
    channelIsSet = false;
    slotIsSet = false;
    sequencerIsSet = false;


}